

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_PopSection(void)

{
  SectionStackEntry *__ptr;
  SectionStackEntry *entry;
  
  __ptr = sectionStack;
  if (sectionStack == (SectionStackEntry *)0x0) {
    fatalerror("No entries in the section stack\n");
  }
  if (currentLoadSection != (Section *)0x0) {
    fatalerror("Cannot change the section within a `LOAD` block\n");
  }
  changeSection();
  currentSection = __ptr->section;
  currentLoadSection = __ptr->loadSection;
  sym_SetCurrentSymbolScope(__ptr->scope);
  curOffset = __ptr->offset;
  loadOffset = __ptr->loadOffset;
  unionStack = __ptr->unionStack;
  sectionStack = __ptr->next;
  free(__ptr);
  return;
}

Assistant:

void sect_PopSection(void)
{
	if (!sectionStack)
		fatalerror("No entries in the section stack\n");

	if (currentLoadSection)
		fatalerror("Cannot change the section within a `LOAD` block\n");

	struct SectionStackEntry *entry = sectionStack;

	changeSection();
	currentSection = entry->section;
	currentLoadSection = entry->loadSection;
	sym_SetCurrentSymbolScope(entry->scope);
	curOffset = entry->offset;
	loadOffset = entry->loadOffset;
	unionStack = entry->unionStack;

	sectionStack = entry->next;
	free(entry);
}